

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

int __thiscall
CVmObjFrameRef::index_val_q
          (CVmObjFrameRef *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  int iVar1;
  int iVar2;
  long lVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  long lVar5;
  long *plVar6;
  
  if (index_val->typ == VM_INT) {
    iVar1 = (index_val->val).intval;
    lVar5 = (long)iVar1;
    if (-1 < lVar5) {
      plVar6 = (long *)(this->super_CVmObject).ext_;
      iVar2 = (int)plVar6[4];
      if (iVar1 < *(int *)((long)plVar6 + 0x24) + iVar2) {
        lVar3 = *plVar6;
        if (lVar3 == 0) {
          plVar6 = plVar6 + lVar5 * 2 + 0xb;
        }
        else if (iVar1 < iVar2) {
          plVar6 = (long *)(lVar3 + lVar5 * 0x10);
        }
        else {
          plVar6 = (long *)(lVar3 + (long)((iVar2 - iVar1) + -0xb) * 0x10 + -0x10);
        }
        aVar4 = *(anon_union_8_8_cb74652f_for_val *)(plVar6 + 1);
        *(long *)result = *plVar6;
        result->val = aVar4;
        return 1;
      }
    }
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjFrameRef::index_val_q(VMG_ vm_val_t *result,
                                vm_obj_id_t self,
                                const vm_val_t *index_val)
{
    /* get our extension */
    vm_frameref_ext *ext = get_ext();

    /* check the type */
    if (index_val->typ == VM_INT)
    {
        /* 
         *   It's a direct index into the frame.  Make sure the value is in
         *   range.  
         */
        int n = index_val->val.intval;
        if (n < 0 || n >= ext->nlocals + ext->nparams)
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /*  
         *   If we have an active stack frame, read the value from the stack;
         *   otherwise read it from the snapshot array.  
         */
        if (ext->fp != 0)
        {
            /* get it from the stack frame */
            if (n < ext->nlocals)
            {
                /* it's in the local variable range */
                *result =
                    *G_interpreter->get_local_from_frame(vmg_ ext->fp, n);
            }
            else
            {
                /* it's in the parameter range */
                *result = *G_interpreter->get_param_from_frame(
                    vmg_ ext->fp, n - ext->nlocals);
            }
        }
        else
        {
            /* there's no frame - get it from the snapshot array */
            *result = ext->vars[n];
        }
    }
    else
    {
        /* invalid index type */
        err_throw(VMERR_INDEX_OUT_OF_RANGE);
    }

    /* handled */
    return TRUE;
}